

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

ssize_t __thiscall zmq::pipe_t::write(pipe_t *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  msg_t *this_00;
  
  this_00 = (msg_t *)CONCAT44(in_register_00000034,__fd);
  bVar1 = check_write(this);
  if (bVar1) {
    bVar2 = msg_t::flags(this_00);
    bVar3 = msg_t::is_routing_id(this_00);
    (*this->_out_pipe->_vptr_ypipe_base_t[2])(this->_out_pipe,this_00,(ulong)(bVar2 & 1));
    if (!bVar3 && (bVar2 & 1) == 0) {
      this->_msgs_written = this->_msgs_written + 1;
    }
  }
  return CONCAT71(extraout_var,bVar1) & 0xffffffff;
}

Assistant:

bool zmq::pipe_t::write (const msg_t *msg_)
{
    if (unlikely (!check_write ()))
        return false;

    const bool more = (msg_->flags () & msg_t::more) != 0;
    const bool is_routing_id = msg_->is_routing_id ();
    _out_pipe->write (*msg_, more);
    if (!more && !is_routing_id)
        _msgs_written++;

    return true;
}